

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  SourceLineInfo *pSVar1;
  XmlWriter *this_00;
  OfType OVar2;
  pointer pMVar3;
  AssertionStats *pAVar4;
  XmlReporter *pXVar5;
  int iVar6;
  XmlWriter *pXVar7;
  string *psVar8;
  pointer pMVar9;
  allocator local_155;
  allocator local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  undefined1 local_150 [32];
  undefined1 local_130 [40];
  SourceLineInfo local_108;
  undefined1 local_e0 [32];
  string local_c0;
  AssertionStats *local_a0;
  XmlReporter *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0 = assertionStats;
  local_98 = this;
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    psVar8 = (string *)(local_130 + 0x28);
    for (pMVar9 = (assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar9 != pMVar3; pMVar9 = pMVar9 + 1) {
      if (pMVar9->type == Warning) {
        std::__cxx11::string::string(psVar8,"Warning",(allocator *)local_150);
        XmlWriter::scopedElement((XmlWriter *)local_130,(string *)&this->m_xml);
        XmlWriter::writeText((XmlWriter *)local_130._0_8_,&pMVar9->message,true);
LAB_001549ed:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_130);
        std::__cxx11::string::~string(psVar8);
      }
      else if (pMVar9->type == Info) {
        std::__cxx11::string::string(psVar8,"Info",(allocator *)local_150);
        XmlWriter::scopedElement((XmlWriter *)local_130,(string *)&this->m_xml);
        XmlWriter::writeText((XmlWriter *)local_130._0_8_,&pMVar9->message,true);
        goto LAB_001549ed;
      }
    }
  }
  pXVar5 = local_98;
  iVar6 = (*(((local_98->super_StreamingReporterBase).m_config.m_p)->super_IShared).
            super_NonCopyable._vptr_NonCopyable[7])();
  pAVar4 = local_a0;
  if (((char)iVar6 == '\0') &&
     (((local_a0->assertionResult).m_resultData.resultType & FailureBit) == Ok)) {
    return true;
  }
  if ((local_a0->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    std::__cxx11::string::string((string *)local_150,"Expression",&local_154);
    this_00 = &pXVar5->m_xml;
    pXVar7 = XmlWriter::startElement(this_00,(string *)local_150);
    std::__cxx11::string::string((string *)(local_e0 + 0x20),"success",&local_155);
    pXVar7 = XmlWriter::writeAttribute
                       (pXVar7,(string *)(local_e0 + 0x20),
                        ((pAVar4->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    std::__cxx11::string::string((string *)&local_70,"type",&local_151);
    std::__cxx11::string::string((string *)&local_90,(string *)&pAVar4->assertionResult);
    pXVar7 = XmlWriter::writeAttribute(pXVar7,&local_70,&local_90);
    std::__cxx11::string::string((string *)local_e0,"filename",&local_152);
    pSVar1 = &(pAVar4->assertionResult).m_info.lineInfo;
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_130 + 0x28),pSVar1);
    pXVar7 = XmlWriter::writeAttribute(pXVar7,(string *)local_e0,(string *)(local_130 + 0x28));
    std::__cxx11::string::string((string *)&local_50,"line",&local_153);
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_130,pSVar1);
    XmlWriter::writeAttribute<unsigned_long>(pXVar7,&local_50,(unsigned_long *)(local_130 + 0x20));
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)(local_130 + 0x28));
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)(local_e0 + 0x20));
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::string
              ((string *)(local_130 + 0x28),"Original",(allocator *)(local_e0 + 0x20));
    XmlWriter::scopedElement((XmlWriter *)local_150,(string *)this_00);
    AssertionResult::getExpression_abi_cxx11_((string *)local_130,&pAVar4->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_150._0_8_,(string *)local_130,true);
    std::__cxx11::string::~string((string *)local_130);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_150);
    std::__cxx11::string::~string((string *)(local_130 + 0x28));
    std::__cxx11::string::string
              ((string *)(local_130 + 0x28),"Expanded",(allocator *)(local_e0 + 0x20));
    XmlWriter::scopedElement((XmlWriter *)local_150,(string *)this_00);
    std::__cxx11::string::string
              ((string *)local_130,(string *)&(pAVar4->assertionResult).m_resultData);
    XmlWriter::writeText((XmlWriter *)local_150._0_8_,(string *)local_130,true);
    std::__cxx11::string::~string((string *)local_130);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_150);
    std::__cxx11::string::~string((string *)(local_130 + 0x28));
  }
  OVar2 = (pAVar4->assertionResult).m_resultData.resultType;
  if (OVar2 == Info) {
    std::__cxx11::string::string((string *)(local_130 + 0x28),"Info",(allocator *)(local_e0 + 0x20))
    ;
    XmlWriter::scopedElement((XmlWriter *)local_150,(string *)&pXVar5->m_xml);
    std::__cxx11::string::string
              ((string *)local_130,(string *)&(pAVar4->assertionResult).m_resultData.message);
    XmlWriter::writeText((XmlWriter *)local_150._0_8_,(string *)local_130,true);
LAB_00154f61:
    std::__cxx11::string::~string((string *)local_130);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_150);
    psVar8 = (string *)(local_130 + 0x28);
  }
  else {
    if (OVar2 == ExplicitFailure) {
      std::__cxx11::string::string
                ((string *)(local_130 + 0x28),"Failure",(allocator *)(local_e0 + 0x20));
      XmlWriter::scopedElement((XmlWriter *)local_150,(string *)&pXVar5->m_xml);
      std::__cxx11::string::string
                ((string *)local_130,(string *)&(pAVar4->assertionResult).m_resultData.message);
      XmlWriter::writeText((XmlWriter *)local_150._0_8_,(string *)local_130,true);
      goto LAB_00154f61;
    }
    if (OVar2 == FatalErrorCondition) {
      std::__cxx11::string::string
                ((string *)local_150,"Fatal Error Condition",(allocator *)&local_50);
      XmlWriter::scopedElement((XmlWriter *)local_e0,(string *)&pXVar5->m_xml);
      std::__cxx11::string::string((string *)(local_e0 + 0x20),"filename",&local_154);
      pSVar1 = &(pAVar4->assertionResult).m_info.lineInfo;
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_130 + 0x28),pSVar1);
      XmlWriter::writeAttribute
                ((XmlWriter *)local_e0._0_8_,(string *)(local_e0 + 0x20),
                 (string *)(local_130 + 0x28));
      std::__cxx11::string::string((string *)&local_70,"line",&local_155);
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_130,pSVar1);
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_e0._0_8_,&local_70,(unsigned_long *)(local_130 + 0x20));
      std::__cxx11::string::string
                ((string *)&local_90,(string *)&(pAVar4->assertionResult).m_resultData.message);
      XmlWriter::writeText((XmlWriter *)local_e0._0_8_,&local_90,true);
    }
    else {
      if (OVar2 != ThrewException) goto LAB_00154f7f;
      std::__cxx11::string::string((string *)local_150,"Exception",(allocator *)&local_50);
      XmlWriter::scopedElement((XmlWriter *)local_e0,(string *)&pXVar5->m_xml);
      std::__cxx11::string::string((string *)(local_e0 + 0x20),"filename",&local_154);
      pSVar1 = &(pAVar4->assertionResult).m_info.lineInfo;
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_130 + 0x28),pSVar1);
      XmlWriter::writeAttribute
                ((XmlWriter *)local_e0._0_8_,(string *)(local_e0 + 0x20),
                 (string *)(local_130 + 0x28));
      std::__cxx11::string::string((string *)&local_70,"line",&local_155);
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_130,pSVar1);
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_e0._0_8_,&local_70,(unsigned_long *)(local_130 + 0x20));
      std::__cxx11::string::string
                ((string *)&local_90,(string *)&(pAVar4->assertionResult).m_resultData.message);
      XmlWriter::writeText((XmlWriter *)local_e0._0_8_,&local_90,true);
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)(local_130 + 0x28));
    std::__cxx11::string::~string((string *)(local_e0 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_e0);
    psVar8 = (string *)local_150;
  }
  std::__cxx11::string::~string(psVar8);
LAB_00154f7f:
  if ((pAVar4->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&pXVar5->m_xml);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) {
            const AssertionResult& assertionResult = assertionStats.assertionResult;

            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "Fatal Error Condition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }

            if( assertionResult.hasExpression() )
                m_xml.endElement();

            return true;
        }